

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

int buf_grow(buf_t *buf)

{
  ulong uVar1;
  uint __line;
  uchar *puVar2;
  char *__assertion;
  
  if (buf == (buf_t *)0x0) {
    __assertion = "buf != NULL";
    __line = 0x1b;
  }
  else {
    uVar1 = buf->size;
    if (uVar1 == 0) {
      __assertion = "buf->size > 0";
      __line = 0x1c;
    }
    else if (buf->data == (uchar *)0x0) {
      __assertion = "buf->data != NULL";
      __line = 0x1d;
    }
    else {
      if (buf->len <= uVar1) {
        puVar2 = (uchar *)realloc(buf->data,uVar1 * 2);
        if (puVar2 != (uchar *)0x0) {
          buf->data = puVar2;
          buf->size = buf->size << 1;
        }
        return (uint)(puVar2 != (uchar *)0x0);
      }
      __assertion = "buf->len <= buf->size";
      __line = 0x1e;
    }
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",
                __line,"int buf_grow(buf_t *)");
}

Assistant:

int buf_grow(buf_t *buf) {
  assert(buf != NULL);
  assert(buf->size > 0);
  assert(buf->data != NULL);
  assert(buf->len <= buf->size);
  
  void *new = realloc(buf->data, buf->size * 2);
  if (new != NULL) {
    buf->data = new;
    buf->size *= 2;
    return 1;
  } else
    return 0;
}